

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O2

Json __thiscall
json11::anon_unknown_21::JsonParser::expect(JsonParser *this,string *expected,Json *res)

{
  size_t sVar1;
  int iVar2;
  undefined8 *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  ulong uVar4;
  Json JVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (expected->_M_string_length != 0) {
    uVar4 = expected->_M_string_length - 1;
    expected->_M_string_length = uVar4;
    iVar2 = std::__cxx11::string::compare
                      ((ulong)(expected->_M_dataplus)._M_p,uVar4,
                       (string *)
                       (res->m_ptr).
                       super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi);
    if (iVar2 == 0) {
      expected->_M_string_length =
           (long)&((res->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_vptr__Sp_counted_base + expected->_M_string_length;
      sVar1 = in_RCX[1];
      in_RCX[1] = 0;
      this->str = (string *)*in_RCX;
      this->i = sVar1;
      *in_RCX = 0;
      _Var3._M_pi = extraout_RDX;
    }
    else {
      std::operator+(&local_60,"parse error: expected ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)res);
      std::operator+(&local_80,&local_60,", got ");
      std::__cxx11::string::substr((ulong)&local_a0,(ulong)(expected->_M_dataplus)._M_p);
      std::operator+(&local_40,&local_80,&local_a0);
      fail(this,expected);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_60);
      _Var3._M_pi = extraout_RDX_00;
    }
    JVar5.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = _Var3._M_pi;
    JVar5.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Json)JVar5.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
  }
  __assert_fail("i != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/json11/json11/json11.cpp"
                ,0x276,
                "Json json11::(anonymous namespace)::JsonParser::expect(const string &, Json)");
}

Assistant:

Json expect(const string &expected, Json res) {
        assert(i != 0);
        i--;
        if (str.compare(i, expected.length(), expected) == 0) {
            i += expected.length();
            return res;
        } else {
            return fail("parse error: expected " + expected + ", got " + str.substr(i, expected.length()));
        }
    }